

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbararealayout.cpp
# Opt level: O2

QLayoutItem * __thiscall QToolBarAreaLayout::itemAt(QToolBarAreaLayout *this,int *x,int index)

{
  int iVar1;
  long lVar2;
  QToolBarAreaLayoutLine *pQVar3;
  long lVar4;
  int i;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  
  lVar5 = 0;
  do {
    if (lVar5 == 4) {
      return (QLayoutItem *)0x0;
    }
    lVar2 = this->docks[lVar5].lines.d.size;
    for (lVar6 = 0; lVar6 != lVar2; lVar6 = lVar6 + 1) {
      pQVar3 = this->docks[lVar5].lines.d.ptr;
      lVar7 = pQVar3[lVar6].toolBarItems.d.size + 1;
      lVar4 = -0x18;
      while (lVar8 = lVar4, lVar7 = lVar7 + -1, lVar7 != 0) {
        iVar1 = *x;
        *x = iVar1 + 1;
        lVar4 = lVar8 + 0x18;
        if (iVar1 == index) {
          return *(QLayoutItem **)((long)&pQVar3[lVar6].toolBarItems.d.ptr[1].widgetItem + lVar8);
        }
      }
    }
    lVar5 = lVar5 + 1;
  } while( true );
}

Assistant:

QLayoutItem *QToolBarAreaLayout::itemAt(int *x, int index) const
{
    Q_ASSERT(x != nullptr);

    for (int i = 0; i < QInternal::DockCount; ++i) {
        const QToolBarAreaLayoutInfo &dock = docks[i];

        for (int j = 0; j < dock.lines.size(); ++j) {
            const QToolBarAreaLayoutLine &line = dock.lines.at(j);

            for (int k = 0; k < line.toolBarItems.size(); ++k) {
                if ((*x)++ == index)
                    return line.toolBarItems.at(k).widgetItem;
            }
        }
    }

    return nullptr;
}